

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_interface.cpp
# Opt level: O1

void __thiscall
cppcms::session_interface::session_interface(session_interface *this,context *context)

{
  _Rb_tree_header *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  hold_ptr<cppcms::session_pool::_data> hVar2;
  _Head_base<0UL,_cppcms::session_api_factory_*,_false> _Var3;
  _data *p_Var4;
  service *this_01;
  hold_ptr<cppcms::session_pool::_data> local_28;
  _Head_base<0UL,_cppcms::session_api_factory_*,_false> _Stack_20;
  
  p_Var1 = &(this->data_)._M_t._M_impl.super__Rb_tree_header;
  (this->data_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->data_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->data_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->data_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->data_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->data_copy_)._M_t._M_impl.super__Rb_tree_header;
  (this->data_copy_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->data_copy_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->data_copy_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->data_copy_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->data_copy_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->context_ = context;
  this->field_0x80 = this->field_0x80 & 7;
  (this->temp_cookie_)._M_dataplus._M_p = (pointer)&(this->temp_cookie_).field_2;
  (this->temp_cookie_)._M_string_length = 0;
  (this->temp_cookie_).field_2._M_local_buf[0] = '\0';
  (this->storage_).super___shared_ptr<cppcms::session_api,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->storage_).super___shared_ptr<cppcms::session_api,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var4 = (_data *)operator_new(0x10);
  p_Var4->pool = (session_pool *)0x0;
  p_Var4->adapter = (session_interface_cookie_adapter *)0x0;
  (this->d).ptr_ = p_Var4;
  init(this,(EVP_PKEY_CTX *)context);
  this_01 = http::context::service(this->context_);
  service::session_pool(this_01);
  session_pool::get((session_pool *)&local_28);
  _Var3._M_head_impl = _Stack_20._M_head_impl;
  hVar2.ptr_ = local_28.ptr_;
  local_28.ptr_ = (_data *)0x0;
  _Stack_20._M_head_impl = (session_api_factory *)0x0;
  this_00 = (this->storage_).super___shared_ptr<cppcms::session_api,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->storage_).super___shared_ptr<cppcms::session_api,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)hVar2.ptr_;
  (this->storage_).super___shared_ptr<cppcms::session_api,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var3._M_head_impl;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if ((_Head_base<0UL,_cppcms::session_api_factory_*,_false>)_Stack_20._M_head_impl !=
      (_Head_base<0UL,_cppcms::session_api_factory_*,_false>)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_20._M_head_impl);
  }
  return;
}

Assistant:

session_interface::session_interface(http::context &context) :
	context_(&context),
	loaded_(0),
	reset_(0),
	csrf_checked_(0),
	csrf_do_validation_(0),
	csrf_validation_(0),
	d(new session_interface::_data())
{
	init();
	storage_=context_->service().session_pool().get();
}